

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt64ToArray
                    (int field_number,int64_t value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = field_number << 3;
  *target = (byte)uVar8;
  if (uVar8 < 0x80) {
    pbVar5 = target + 1;
  }
  else {
    *target = (byte)uVar8 | 0x80;
    target[1] = (uint8_t)(uVar8 >> 7);
    pbVar5 = target + 2;
    if (0x3fff < uVar8) {
      uVar4 = (uint)target[1];
      uVar8 = uVar8 >> 7;
      do {
        pbVar5[-1] = (byte)uVar4 | 0x80;
        uVar4 = uVar8 >> 7;
        *pbVar5 = (byte)uVar4;
        pbVar5 = pbVar5 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar4;
      } while (bVar1);
    }
  }
  *pbVar5 = (byte)value;
  if ((ulong)value < 0x80) {
    return pbVar5 + 1;
  }
  *pbVar5 = (byte)value | 0x80;
  pbVar5[1] = (byte)((ulong)value >> 7);
  pbVar2 = pbVar5 + 2;
  if (0x3fff < (ulong)value) {
    uVar7 = (ulong)pbVar5[1];
    uVar6 = (ulong)value >> 7;
    do {
      pbVar2[-1] = (byte)uVar7 | 0x80;
      uVar3 = uVar6 >> 7;
      *pbVar2 = (byte)uVar3;
      pbVar2 = pbVar2 + 1;
      uVar7 = uVar3 & 0xffffffff;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar3;
    } while (bVar1);
  }
  return pbVar2;
}

Assistant:

constexpr inline uint32_t WireFormatLite::MakeTag(int field_number,
                                                  WireType type) {
  return GOOGLE_PROTOBUF_WIRE_FORMAT_MAKE_TAG(field_number, type);
}